

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

void rf_draw_circle_gradient(int center_x,int center_y,float radius,rf_color color1,rf_color color2)

{
  _Bool _Var1;
  float fVar2;
  float fVar3;
  undefined8 local_28;
  rf_int i;
  float radius_local;
  int center_y_local;
  int center_x_local;
  rf_color color2_local;
  rf_color color1_local;
  
  _Var1 = rf_gfx_check_buffer_limit(0x6c);
  if (_Var1) {
    rf_gfx_draw();
  }
  rf_gfx_begin(RF_TRIANGLES);
  for (local_28 = 0; local_28 < 0x168; local_28 = local_28 + 10) {
    center_x_local._0_1_ = color1.r;
    center_x_local._1_1_ = color1.g;
    center_x_local._2_1_ = color1.b;
    center_x_local._3_1_ = color1.a;
    rf_gfx_color4ub((uchar)center_x_local,center_x_local._1_1_,center_x_local._2_1_,
                    center_x_local._3_1_);
    rf_gfx_vertex2f((float)center_x,(float)center_y);
    center_y_local._0_1_ = color2.r;
    center_y_local._1_1_ = color2.g;
    center_y_local._2_1_ = color2.b;
    center_y_local._3_1_ = color2.a;
    rf_gfx_color4ub((uchar)center_y_local,center_y_local._1_1_,center_y_local._2_1_,
                    center_y_local._3_1_);
    fVar2 = sinf((float)local_28 * 0.017453292);
    fVar3 = cosf((float)local_28 * 0.017453292);
    rf_gfx_vertex2f(fVar2 * radius + (float)center_x,fVar3 * radius + (float)center_y);
    rf_gfx_color4ub((uchar)center_y_local,center_y_local._1_1_,center_y_local._2_1_,
                    center_y_local._3_1_);
    fVar2 = sinf((float)(local_28 + 10) * 0.017453292);
    fVar3 = cosf((float)(local_28 + 10) * 0.017453292);
    rf_gfx_vertex2f(fVar2 * radius + (float)center_x,fVar3 * radius + (float)center_y);
  }
  rf_gfx_end();
  return;
}

Assistant:

RF_API void rf_draw_circle_gradient(int center_x, int center_y, float radius, rf_color color1, rf_color color2)
{
    if (rf_gfx_check_buffer_limit(3 * 36)) rf_gfx_draw();

    rf_gfx_begin(RF_TRIANGLES);
    for (rf_int i = 0; i < 360; i += 10)
    {
        rf_gfx_color4ub(color1.r, color1.g, color1.b, color1.a);
        rf_gfx_vertex2f(center_x, center_y);
        rf_gfx_color4ub(color2.r, color2.g, color2.b, color2.a);
        rf_gfx_vertex2f(center_x + sinf(RF_DEG2RAD*i)*radius, center_y + cosf(RF_DEG2RAD*i)*radius);
        rf_gfx_color4ub(color2.r, color2.g, color2.b, color2.a);
        rf_gfx_vertex2f(center_x + sinf(RF_DEG2RAD*(i + 10))*radius, center_y + cosf(RF_DEG2RAD*(i + 10))*radius);
    }
    rf_gfx_end();
}